

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::GatherTesselationShader::Run(GatherTesselationShader *this)

{
  CallLogWrapper *this_00;
  float *pfVar1;
  float fVar2;
  undefined8 src_vs;
  long *src_tes;
  long *src_tcs;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  long lVar6;
  bool *compile_error;
  float fVar7;
  float fVar8;
  Vec4 data;
  long local_d8 [3];
  GLenum drawBuffer;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  GLfloat colorf [4];
  Vec4 buffData;
  
  iVar4 = (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
            [0x24])();
  if ((char)iVar4 == '\0') {
LAB_008facbf:
    lVar6 = 0;
  }
  else {
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])
              (this);
    this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&(this->super_GatherBase).rbo);
    glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,(this->super_GatherBase).rbo);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])
              (this);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (this_00,0x8d40,0x8ce0,0x8d41,(this->super_GatherBase).rbo);
    drawBuffer = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers(this_00,1,&drawBuffer);
    colorf[0] = 0.0;
    colorf[1] = 0.0;
    colorf[2] = 0.0;
    colorf[3] = 0.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,colorf);
    glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&(this->super_GatherBase).vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,(this->super_GatherBase).vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])
              (&buffData,this);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&buffData,0x88e4);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1a])
              (&data,this);
    src_vs = data.m_data._0_8_;
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x27])
              (local_78,this);
    src_tcs = local_78[0];
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x28])
              (local_98,this);
    src_tes = local_98[0];
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
              (local_b8,this);
    GVar5 = TGBase::CreateProgram
                      ((TGBase *)this,(char *)src_vs,(char *)src_tcs,(char *)src_tes,(char *)0x0,
                       (char *)local_b8[0]);
    (this->super_GatherBase).program = GVar5;
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if ((long *)data.m_data._0_8_ != local_d8) {
      operator_delete((void *)data.m_data._0_8_,local_d8[0] + 1);
    }
    glu::CallLogWrapper::glBindAttribLocation(this_00,(this->super_GatherBase).program,0,"v_in_0");
    glu::CallLogWrapper::glBindFragDataLocation
              (this_00,(this->super_GatherBase).program,0,"f_out_0");
    glu::CallLogWrapper::glLinkProgram(this_00,(this->super_GatherBase).program);
    bVar3 = TGBase::CheckProgram((TGBase *)this,(this->super_GatherBase).program,compile_error);
    if (!bVar3) {
      return -1;
    }
    glu::CallLogWrapper::glUseProgram(this_00,(this->super_GatherBase).program);
    glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
    glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    glu::CallLogWrapper::glDeleteProgram(this_00,(this->super_GatherBase).program);
    data.m_data[0] = 0.0;
    data.m_data[1] = 0.0;
    data.m_data[2] = 0.0;
    data.m_data[3] = 0.0;
    glu::CallLogWrapper::glReadPixels(this_00,0,0,1,1,0x1908,0x1406,&data);
    fVar7 = -data.m_data[0];
    if (-data.m_data[0] <= data.m_data[0]) {
      fVar7 = data.m_data[0];
    }
    fVar2 = (this->super_GatherBase).super_TGBase.g_color_eps.m_data[0];
    if (fVar7 <= fVar2) {
      fVar8 = data.m_data[1] + -1.0;
      fVar7 = -fVar8;
      if (-fVar8 <= fVar8) {
        fVar7 = fVar8;
      }
      pfVar1 = (this->super_GatherBase).super_TGBase.g_color_eps.m_data + 1;
      if (fVar7 < *pfVar1 || fVar7 == *pfVar1) {
        fVar7 = -data.m_data[2];
        if (-data.m_data[2] <= data.m_data[2]) {
          fVar7 = data.m_data[2];
        }
        pfVar1 = (this->super_GatherBase).super_TGBase.g_color_eps.m_data + 2;
        if (fVar7 < *pfVar1 || fVar7 == *pfVar1) {
          fVar8 = data.m_data[3] + -1.0;
          fVar7 = -fVar8;
          if (-fVar8 <= fVar8) {
            fVar7 = fVar8;
          }
          pfVar1 = (this->super_GatherBase).super_TGBase.g_color_eps.m_data + 3;
          if (fVar7 < *pfVar1 || fVar7 == *pfVar1) goto LAB_008facbf;
        }
      }
    }
    anon_unknown_0::Output
              ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",
               SUB84((double)data.m_data[0],0),(double)data.m_data[1],(double)data.m_data[2],
               (double)data.m_data[3],(double)fVar2,
               (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[1],
               (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[2],
               (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[3]);
    lVar6 = -1;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{

		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		SetRbo();
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		program = CreateProgram(VertexShader().c_str(), ControlShader().c_str(), EvalShader().c_str(), NULL,
								FragmentShader().c_str());
		glBindAttribLocation(program, 0, "v_in_0");
		glBindFragDataLocation(program, 0, "f_out_0");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glReadBuffer(GL_COLOR_ATTACHMENT0);

		glDeleteProgram(program);
		Vec4 data;
		glReadPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, &data);
		if (!ColorEqual(data, Vec4(0, 1, 0, 1), g_color_eps))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", data.x(), data.y(),
				   data.z(), data.w(), g_color_eps.x(), g_color_eps.y(), g_color_eps.z(), g_color_eps.w());
			return ERROR;
		}
		return NO_ERROR;
	}